

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_362fcb::MkTimeResult::MkTimeResult(MkTimeResult *this)

{
  MkTimeResult *this_local;
  
  (this->local).tm_sec = 0;
  (this->local).tm_min = 0;
  (this->local).tm_hour = 0;
  (this->local).tm_mday = 0;
  (this->local).tm_mon = 0;
  (this->local).tm_year = 0;
  (this->local).tm_wday = 0;
  (this->local).tm_yday = 0;
  (this->local).tm_isdst = 0;
  (this->local).tm_gmtoff = 0;
  (this->local).tm_zone = (char *)0x0;
  this->utcSecs = -1;
  this->good = false;
  this->adjusted = true;
  (this->local).tm_isdst = -1;
  return;
}

Assistant:

MkTimeResult() { local.tm_isdst = -1; }